

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

Float pbrt::HairBxDF::Mp(Float cosTheta_i,Float cosTheta_o,Float sinTheta_i,Float sinTheta_o,Float v
                        )

{
  float fVar1;
  Float FVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float in_XMM2_Da;
  float in_XMM4_Da;
  Float mp;
  Float b;
  Float a;
  Float in_stack_ffffffffffffffd0;
  undefined4 local_24;
  float in_stack_ffffffffffffffe0;
  
  if (0.1 < in_XMM4_Da) {
    fVar1 = FastExp(in_stack_ffffffffffffffe0);
    FVar2 = I0(in_XMM2_Da);
    auVar5._0_4_ = 1.0 / in_XMM4_Da;
    auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar3 = std::sinh(auVar5._0_8_);
    local_24 = (fVar1 * FVar2) / (SUB84(dVar3,0) * 2.0 * in_XMM4_Da);
  }
  else {
    LogI0(in_stack_ffffffffffffffd0);
    auVar4._0_4_ = 1.0 / (in_XMM4_Da * 2.0);
    auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
    std::log(auVar4._0_8_);
    local_24 = FastExp(in_stack_ffffffffffffffe0);
  }
  return local_24;
}

Assistant:

PBRT_CPU_GPU static Float Mp(Float cosTheta_i, Float cosTheta_o, Float sinTheta_i,
                                 Float sinTheta_o, Float v) {
        Float a = cosTheta_i * cosTheta_o / v, b = sinTheta_i * sinTheta_o / v;
        Float mp = (v <= .1)
                       ? (FastExp(LogI0(a) - b - 1 / v + 0.6931f + std::log(1 / (2 * v))))
                       : (FastExp(-b) * I0(a)) / (std::sinh(1 / v) * 2 * v);
        DCHECK(!IsInf(mp) && !IsNaN(mp));
        return mp;
    }